

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O3

void __thiscall
gtest_suite_NoiseModelUpdateTest_::
UpdateSuccessForScaledWhiteNoise<BitDepthParams<unsigned_short,_10,_true>_>::TestBody
          (UpdateSuccessForScaledWhiteNoise<BitDepthParams<unsigned_short,_10,_true>_> *this)

{
  int *rhs;
  long lVar1;
  uint uVar2;
  undefined8 uVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int x;
  long lVar8;
  SEARCH_METHODS *pSVar9;
  ushort uVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  char *in_stack_ffffffffffffff68;
  int iVar14;
  undefined4 in_stack_ffffffffffffff74;
  anon_enum_32 aVar15;
  undefined4 in_stack_ffffffffffffff7c;
  undefined8 *local_80;
  aom_noise_strength_lut_t lut;
  AssertHelper in_stack_ffffffffffffff98;
  double std;
  aom_noise_state_t *val1;
  
  uVar7 = 0;
  do {
    dVar12 = *(double *)(&DAT_00c23220 + (ulong)(uVar7 < 0x40) * 8);
    uVar10 = 0xf7;
    if (uVar7 < 0x40) {
      uVar10 = 6;
    }
    lVar6 = uVar7 * 0x80;
    lVar8 = 0;
    do {
      lVar1 = lVar6 + lVar8;
      lVar11 = -3;
      do {
        dVar13 = anon_unknown.dwarf_9b569f::randn
                           (&(this->
                             super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                             random_,dVar12);
        uVar5 = (uint)(dVar13 + (double)uVar10);
        if (0xfe < (int)uVar5) {
          uVar5 = 0xff;
        }
        (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).denoised_ptr_
        [lVar11][lVar1] = (data_type_t_conflict)((uVar5 & 0xff) << 2);
        *(ushort *)
         ((long)(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                noise_ptr_[lVar11] + lVar1 * 2) = uVar10 << 2;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x80);
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x80);
  lut.points._0_1_ = '\x01';
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
            (&(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
              flat_blocks_,
             (long)(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                   flat_blocks_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                   flat_blocks_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(value_type_conflict3 *)&lut);
  aVar15 = AOM_CODEC_OK;
  bVar4 = aom_noise_model_update
                    (&(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                      model_,(this->
                             super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                             data_ptr_raw_,
                     (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                     denoised_ptr_raw_,0x80,0x80,
                     (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                     strides_,(this->
                              super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>)
                              .chroma_sub_,
                     (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                     flat_blocks_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,0x10);
  uVar5 = (uint)bVar4;
  testing::internal::EqHelper::
  Compare<(unnamed_enum_at__workspace_llm4binary_github_license_all_cmakelists_1510_m_ab_s[P]aom_aom_dsp_noise_model_h:206:1),_int,_nullptr>
            ((EqHelper *)&lut,"AOM_NOISE_STATUS_OK","this->NoiseModelUpdate()",
             (anon_enum_32 *)&stack0xffffffffffffff78,(int *)&stack0xffffffffffffff70);
  if ((char)lut.points == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (lut._8_8_ == 0) {
      pSVar9 = "";
    }
    else {
      pSVar9 = *(SEARCH_METHODS **)lut._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x2ce,(char *)pSVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff70,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
    if ((long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) + 8))();
    }
  }
  uVar3 = lut._8_8_;
  if (lut._8_8_ != 0) {
    if (*(void **)lut._8_8_ != (void *)(lut._8_8_ + 0x10)) {
      operator_delete(*(void **)lut._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  uVar2 = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).model_.n;
  std = (double)(ulong)uVar2;
  val1 = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).model_.
         combined_state;
  lVar6 = 0;
  do {
    if (0 < (int)uVar2) {
      dVar12 = 0.0;
      do {
        testing::internal::DoubleNearPredFormat
                  ((char *)CONCAT44(in_stack_ffffffffffffff74,uVar5),in_stack_ffffffffffffff68,
                   (char *)CONCAT44(in_stack_ffffffffffffff7c,aVar15),(double)val1,std,
                   (double)in_stack_ffffffffffffff98.data_);
        if ((char)lut.points == '\0') {
          testing::Message::Message((Message *)&stack0xffffffffffffff78);
          pSVar9 = "";
          if (lut._8_8_ != 0) {
            pSVar9 = *(SEARCH_METHODS **)lut._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffff70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                     ,0x2d5,(char *)pSVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffff70,(Message *)&stack0xffffffffffffff78);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
          if ((long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) + 8))();
          }
        }
        uVar3 = lut._8_8_;
        if (lut._8_8_ != 0) {
          if (*(void **)lut._8_8_ != (void *)(lut._8_8_ + 0x10)) {
            operator_delete(*(void **)lut._8_8_);
          }
          operator_delete((void *)uVar3);
        }
        testing::internal::DoubleNearPredFormat
                  ((char *)CONCAT44(in_stack_ffffffffffffff74,uVar5),in_stack_ffffffffffffff68,
                   (char *)CONCAT44(in_stack_ffffffffffffff7c,aVar15),(double)val1,std,
                   (double)in_stack_ffffffffffffff98.data_);
        if ((char)lut.points == '\0') {
          testing::Message::Message((Message *)&stack0xffffffffffffff78);
          pSVar9 = "";
          if (lut._8_8_ != 0) {
            pSVar9 = *(SEARCH_METHODS **)lut._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffff70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                     ,0x2d6,(char *)pSVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffff70,(Message *)&stack0xffffffffffffff78);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
          if ((long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) + 8))();
          }
        }
        uVar3 = lut._8_8_;
        if (lut._8_8_ != 0) {
          if (*(void **)lut._8_8_ != (void *)(lut._8_8_ + 0x10)) {
            operator_delete(*(void **)lut._8_8_);
          }
          operator_delete((void *)uVar3);
        }
        dVar12 = (double)((long)dVar12 + 1);
      } while (std != dVar12);
    }
    if (lVar6 != 0) {
      aVar15 = uVar2 + ADST_DCT;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&lut,"n + 1","model.latest_state[c].eqns.n",
                 (int *)&stack0xffffffffffffff78,
                 &(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                  model_.latest_state[lVar6].eqns.n);
      uVar3 = lut._8_8_;
      if ((char)lut.points == '\0') {
        testing::Message::Message((Message *)&stack0xffffffffffffff78);
        if (lut._8_8_ == 0) {
          pSVar9 = "";
        }
        else {
          pSVar9 = *(SEARCH_METHODS **)lut._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x2d9,(char *)pSVar9);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff70,(Message *)&stack0xffffffffffffff78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
        if ((long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) + 8))();
        }
        if (lut._8_8_ == 0) {
          return;
        }
        local_80 = (undefined8 *)lut._8_8_;
        if (*(void **)lut._8_8_ != (void *)(lut._8_8_ + 0x10)) {
          operator_delete(*(void **)lut._8_8_);
        }
        goto LAB_005029ca;
      }
      if (lut._8_8_ != 0) {
        if (*(void **)lut._8_8_ != (void *)(lut._8_8_ + 0x10)) {
          operator_delete(*(void **)lut._8_8_);
        }
        operator_delete((void *)uVar3);
      }
      aVar15 = uVar2 + ADST_DCT;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&lut,"n + 1","model.combined_state[c].eqns.n",
                 (int *)&stack0xffffffffffffff78,&val1[lVar6].eqns.n);
      uVar3 = lut._8_8_;
      if ((char)lut.points == '\0') {
        testing::Message::Message((Message *)&stack0xffffffffffffff78);
        if (lut._8_8_ == 0) {
          pSVar9 = "";
        }
        else {
          pSVar9 = *(SEARCH_METHODS **)lut._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x2da,(char *)pSVar9);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff70,(Message *)&stack0xffffffffffffff78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
        if ((long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) + 8))();
        }
        if (lut._8_8_ == 0) {
          return;
        }
        local_80 = (undefined8 *)lut._8_8_;
        if (*(void **)lut._8_8_ != (void *)(lut._8_8_ + 0x10)) {
          operator_delete(*(void **)lut._8_8_);
        }
        goto LAB_005029ca;
      }
      if (lut._8_8_ != 0) {
        if (*(void **)lut._8_8_ != (void *)(lut._8_8_ + 0x10)) {
          operator_delete(*(void **)lut._8_8_);
        }
        operator_delete((void *)uVar3);
      }
      testing::internal::DoubleNearPredFormat
                ((char *)CONCAT44(in_stack_ffffffffffffff74,uVar5),in_stack_ffffffffffffff68,
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,aVar15),(double)val1,std,
                 (double)in_stack_ffffffffffffff98.data_);
      if ((char)lut.points == '\0') {
        testing::Message::Message((Message *)&stack0xffffffffffffff78);
        pSVar9 = "";
        if (lut._8_8_ != 0) {
          pSVar9 = *(SEARCH_METHODS **)lut._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x2dd,(char *)pSVar9);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff70,(Message *)&stack0xffffffffffffff78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
        if ((long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) + 8))();
        }
      }
      uVar3 = lut._8_8_;
      if (lut._8_8_ != 0) {
        if (*(void **)lut._8_8_ != (void *)(lut._8_8_ + 0x10)) {
          operator_delete(*(void **)lut._8_8_);
        }
        operator_delete((void *)uVar3);
      }
      testing::internal::DoubleNearPredFormat
                ((char *)CONCAT44(in_stack_ffffffffffffff74,uVar5),in_stack_ffffffffffffff68,
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,aVar15),(double)val1,std,
                 (double)in_stack_ffffffffffffff98.data_);
      if ((char)lut.points == '\0') {
        testing::Message::Message((Message *)&stack0xffffffffffffff78);
        pSVar9 = "";
        if (lut._8_8_ != 0) {
          pSVar9 = *(SEARCH_METHODS **)lut._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x2de,(char *)pSVar9);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff70,(Message *)&stack0xffffffffffffff78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
        if ((long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) + 8))();
        }
      }
      uVar3 = lut._8_8_;
      if (lut._8_8_ != 0) {
        if (*(void **)lut._8_8_ != (void *)(lut._8_8_ + 0x10)) {
          operator_delete(*(void **)lut._8_8_);
        }
        operator_delete((void *)uVar3);
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  aVar15 = NEW_NEARESTMV;
  rhs = &(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).model_.
         latest_state[0].strength_solver.eqns.n;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&lut,"20","model.latest_state[0].strength_solver.eqns.n",
             (int *)&stack0xffffffffffffff78,rhs);
  uVar3 = lut._8_8_;
  if ((char)lut.points == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    if (lut._8_8_ == 0) {
      pSVar9 = "";
    }
    else {
      pSVar9 = *(SEARCH_METHODS **)lut._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x2e7,(char *)pSVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff70,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
    if ((long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) + 8))();
    }
    if (lut._8_8_ == 0) {
      return;
    }
    local_80 = (undefined8 *)lut._8_8_;
    if (*(void **)lut._8_8_ != (void *)(lut._8_8_ + 0x10)) {
      operator_delete(*(void **)lut._8_8_);
    }
  }
  else {
    if (lut._8_8_ != 0) {
      if (*(void **)lut._8_8_ != (void *)(lut._8_8_ + 0x10)) {
        operator_delete(*(void **)lut._8_8_);
      }
      operator_delete((void *)uVar3);
    }
    if (0 < *rhs) {
      lVar6 = 0;
      do {
        dVar12 = (double)(int)lVar6 / 19.0;
        std = dVar12 * 4.0 + (1.0 - dVar12);
        testing::internal::DoubleNearPredFormat
                  ((char *)CONCAT44(in_stack_ffffffffffffff74,uVar5),in_stack_ffffffffffffff68,
                   (char *)CONCAT44(in_stack_ffffffffffffff7c,aVar15),(double)val1,std,
                   (double)in_stack_ffffffffffffff98.data_);
        if ((char)lut.points == '\0') {
          testing::Message::Message((Message *)&stack0xffffffffffffff78);
          pSVar9 = "";
          if (lut._8_8_ != 0) {
            pSVar9 = *(SEARCH_METHODS **)lut._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffff70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                     ,0x2ed,(char *)pSVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffff70,(Message *)&stack0xffffffffffffff78);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
          if ((long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) + 8))();
          }
        }
        uVar3 = lut._8_8_;
        if (lut._8_8_ != 0) {
          if (*(void **)lut._8_8_ != (void *)(lut._8_8_ + 0x10)) {
            operator_delete(*(void **)lut._8_8_);
          }
          operator_delete((void *)uVar3);
        }
        testing::internal::DoubleNearPredFormat
                  ((char *)CONCAT44(in_stack_ffffffffffffff74,uVar5),in_stack_ffffffffffffff68,
                   (char *)CONCAT44(in_stack_ffffffffffffff7c,aVar15),(double)val1,std,
                   (double)in_stack_ffffffffffffff98.data_);
        if ((char)lut.points == '\0') {
          testing::Message::Message((Message *)&stack0xffffffffffffff78);
          pSVar9 = "";
          if (lut._8_8_ != 0) {
            pSVar9 = *(SEARCH_METHODS **)lut._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffff70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                     ,0x2f0,(char *)pSVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffff70,(Message *)&stack0xffffffffffffff78);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
          if ((long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff7c,aVar15) + 8))();
          }
        }
        uVar3 = lut._8_8_;
        if (lut._8_8_ != 0) {
          if (*(void **)lut._8_8_ != (void *)(lut._8_8_ + 0x10)) {
            operator_delete(*(void **)lut._8_8_);
          }
          operator_delete((void *)uVar3);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < *rhs);
    }
    aom_noise_strength_solver_fit_piecewise
              (&(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).model_
                .latest_state[0].strength_solver,2,&lut);
    iVar14 = 2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&stack0xffffffffffffff78,"2","lut.num_points",
               (int *)&stack0xffffffffffffff70,&lut.num_points);
    if (SUB41(aVar15,0) != (internal)0x0) {
      if (local_80 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_80 != local_80 + 2) {
          operator_delete((undefined8 *)*local_80);
        }
        operator_delete(local_80);
      }
      testing::internal::DoubleNearPredFormat
                ((char *)CONCAT44(in_stack_ffffffffffffff74,iVar14),in_stack_ffffffffffffff68,
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,aVar15),(double)val1,std,
                 (double)in_stack_ffffffffffffff98.data_);
      if (SUB41(aVar15,0) == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffff70);
        if (local_80 == (undefined8 *)0x0) {
          pSVar9 = "";
        }
        else {
          pSVar9 = (SEARCH_METHODS *)*local_80;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x2f9,(char *)pSVar9);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff98,(Message *)&stack0xffffffffffffff70);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff98);
        if ((long *)CONCAT44(in_stack_ffffffffffffff74,iVar14) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff74,iVar14) + 8))();
        }
      }
      if (local_80 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_80 != local_80 + 2) {
          operator_delete((undefined8 *)*local_80);
        }
        operator_delete(local_80);
      }
      testing::internal::DoubleNearPredFormat
                ((char *)CONCAT44(in_stack_ffffffffffffff74,iVar14),in_stack_ffffffffffffff68,
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,aVar15),(double)val1,std,
                 (double)in_stack_ffffffffffffff98.data_);
      if (SUB41(aVar15,0) == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffff70);
        if (local_80 == (undefined8 *)0x0) {
          pSVar9 = "";
        }
        else {
          pSVar9 = (SEARCH_METHODS *)*local_80;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x2fa,(char *)pSVar9);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff98,(Message *)&stack0xffffffffffffff70);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff98);
        if ((long *)CONCAT44(in_stack_ffffffffffffff74,iVar14) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff74,iVar14) + 8))();
        }
      }
      if (local_80 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_80 != local_80 + 2) {
          operator_delete((undefined8 *)*local_80);
        }
        operator_delete(local_80);
      }
      testing::internal::DoubleNearPredFormat
                ((char *)CONCAT44(in_stack_ffffffffffffff74,iVar14),in_stack_ffffffffffffff68,
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,aVar15),(double)val1,std,
                 (double)in_stack_ffffffffffffff98.data_);
      if (SUB41(aVar15,0) == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffff70);
        if (local_80 == (undefined8 *)0x0) {
          pSVar9 = "";
        }
        else {
          pSVar9 = (SEARCH_METHODS *)*local_80;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x2fb,(char *)pSVar9);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff98,(Message *)&stack0xffffffffffffff70);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff98);
        if ((long *)CONCAT44(in_stack_ffffffffffffff74,iVar14) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff74,iVar14) + 8))();
        }
      }
      if (local_80 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_80 != local_80 + 2) {
          operator_delete((undefined8 *)*local_80);
        }
        operator_delete(local_80);
      }
      testing::internal::DoubleNearPredFormat
                ((char *)CONCAT44(in_stack_ffffffffffffff74,iVar14),in_stack_ffffffffffffff68,
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,aVar15),(double)val1,std,
                 (double)in_stack_ffffffffffffff98.data_);
      if (SUB41(aVar15,0) == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffff70);
        if (local_80 == (undefined8 *)0x0) {
          pSVar9 = "";
        }
        else {
          pSVar9 = (SEARCH_METHODS *)*local_80;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                   ,0x2fc,(char *)pSVar9);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff98,(Message *)&stack0xffffffffffffff70);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff98);
        if ((long *)CONCAT44(in_stack_ffffffffffffff74,iVar14) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff74,iVar14) + 8))();
        }
      }
      if (local_80 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_80 != local_80 + 2) {
          operator_delete((undefined8 *)*local_80);
        }
        operator_delete(local_80);
      }
      aom_noise_strength_lut_free(&lut);
      return;
    }
    testing::Message::Message((Message *)&stack0xffffffffffffff70);
    if (local_80 == (undefined8 *)0x0) {
      pSVar9 = "";
    }
    else {
      pSVar9 = (SEARCH_METHODS *)*local_80;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x2f8,(char *)pSVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff98,(Message *)&stack0xffffffffffffff70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff98);
    if ((long *)CONCAT44(in_stack_ffffffffffffff74,iVar14) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff74,iVar14) + 8))();
    }
    if (local_80 == (undefined8 *)0x0) {
      return;
    }
    if ((undefined8 *)*local_80 != local_80 + 2) {
      operator_delete((undefined8 *)*local_80);
    }
  }
LAB_005029ca:
  operator_delete(local_80);
  return;
}

Assistant:

TYPED_TEST_P(NoiseModelUpdateTest, UpdateSuccessForScaledWhiteNoise) {
  aom_noise_model_t &model = this->model_;
  const int width = this->kWidth;
  const int height = this->kHeight;

  const double kCoeffEps = 0.055;
  const double kLowStd = 1;
  const double kHighStd = 4;
  const int shift = this->kBitDepth - 8;
  for (int y = 0; y < height; ++y) {
    for (int x = 0; x < width; ++x) {
      for (int c = 0; c < 3; ++c) {
        // The image data is bimodal:
        // Bottom half has low intensity and low noise strength
        // Top half has high intensity and high noise strength
        const int avg = (y < height / 2) ? 4 : 245;
        const double std = (y < height / 2) ? kLowStd : kHighStd;
        this->data_ptr_[c][y * width + x] =
            ((uint8_t)std::min((int)255,
                               (int)(2 + avg + randn(&this->random_, std))))
            << shift;
        this->denoised_ptr_[c][y * width + x] = (2 + avg) << shift;
      }
    }
  }
  // Label all blocks as flat for the update
  this->flat_blocks_.assign(this->flat_blocks_.size(), 1);
  EXPECT_EQ(AOM_NOISE_STATUS_OK, this->NoiseModelUpdate());

  const int n = model.n;
  // The noise is uncorrelated spatially and with the y channel.
  // All coefficients should be reasonably close to zero.
  for (int c = 0; c < 3; ++c) {
    for (int i = 0; i < n; ++i) {
      EXPECT_NEAR(0, model.latest_state[c].eqns.x[i], kCoeffEps);
      EXPECT_NEAR(0, model.combined_state[c].eqns.x[i], kCoeffEps);
    }
    if (c > 0) {
      ASSERT_EQ(n + 1, model.latest_state[c].eqns.n);
      ASSERT_EQ(n + 1, model.combined_state[c].eqns.n);

      // The correlation to the y channel should be low (near zero)
      EXPECT_NEAR(0, model.latest_state[c].eqns.x[n], kCoeffEps);
      EXPECT_NEAR(0, model.combined_state[c].eqns.x[n], kCoeffEps);
    }
  }

  // Noise strength should vary between kLowStd and kHighStd.
  const double kStdEps = 0.15;
  // We have to normalize fitted standard deviation based on bit depth.
  const double normalize = (1 << shift);

  ASSERT_EQ(20, model.latest_state[0].strength_solver.eqns.n);
  for (int i = 0; i < model.latest_state[0].strength_solver.eqns.n; ++i) {
    const double a = i / 19.0;
    const double expected = (kLowStd * (1.0 - a) + kHighStd * a);
    EXPECT_NEAR(expected,
                model.latest_state[0].strength_solver.eqns.x[i] / normalize,
                kStdEps);
    EXPECT_NEAR(expected,
                model.combined_state[0].strength_solver.eqns.x[i] / normalize,
                kStdEps);
  }

  // If we fit a piecewise linear model, there should be two points:
  // one near kLowStd at 0, and the other near kHighStd and 255.
  aom_noise_strength_lut_t lut;
  aom_noise_strength_solver_fit_piecewise(
      &model.latest_state[0].strength_solver, 2, &lut);
  ASSERT_EQ(2, lut.num_points);
  EXPECT_NEAR(0, lut.points[0][0], 1e-4);
  EXPECT_NEAR(kLowStd, lut.points[0][1] / normalize, kStdEps);
  EXPECT_NEAR((1 << this->kBitDepth) - 1, lut.points[1][0], 1e-5);
  EXPECT_NEAR(kHighStd, lut.points[1][1] / normalize, kStdEps);
  aom_noise_strength_lut_free(&lut);
}